

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O1

float Abc_NtkMfsTotalSwitching(Abc_Ntk_t *pNtk)

{
  void *pvVar1;
  int *__ptr;
  Abc_Ntk_t *pNtk_00;
  long lVar2;
  Aig_Man_t *pAig;
  Vec_Int_t *__ptr_00;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  float fVar7;
  
  pNtk_00 = Abc_NtkStrash(pNtk,0,1,0);
  pVVar3 = pNtk->vObjs;
  if (0 < pVVar3->nSize) {
    lVar2 = 0;
    do {
      pvVar1 = pVVar3->pArray[lVar2];
      if ((pvVar1 != (void *)0x0) &&
         ((((*(ulong *)((long)pvVar1 + 0x40) != 0 &&
            ((*(byte *)((*(ulong *)((long)pvVar1 + 0x40) & 0xfffffffffffffffe) + 0x14) & 0xf) == 0))
           || (uVar5 = *(uint *)((long)pvVar1 + 0x14) & 0xf, 7 < uVar5)) ||
          ((0xa4U >> uVar5 & 1) == 0)))) {
        *(undefined8 *)((long)pvVar1 + 0x40) = 0;
      }
      lVar2 = lVar2 + 1;
      pVVar3 = pNtk->vObjs;
    } while (lVar2 < pVVar3->nSize);
  }
  pAig = Abc_NtkToDar(pNtk_00,0,(uint)(0 < pNtk->nObjCounts[8]));
  __ptr_00 = Saig_ManComputeSwitchProbs(pAig,0x30,0x10,0);
  __ptr = __ptr_00->pArray;
  lVar2 = (long)pNtk->vObjs->nSize;
  if (lVar2 < 1) {
    fVar7 = 0.0;
  }
  else {
    fVar7 = 0.0;
    lVar4 = 0;
    do {
      pvVar1 = pNtk->vObjs->pArray[lVar4];
      if (((pvVar1 != (void *)0x0) &&
          (uVar6 = *(ulong *)((long)pvVar1 + 0x40) & 0xfffffffffffffffe, uVar6 != 0)) &&
         (uVar6 = *(ulong *)(uVar6 + 0x40) & 0xfffffffffffffffe, uVar6 != 0)) {
        fVar7 = fVar7 + (float)*(int *)((long)pvVar1 + 0x2c) * (float)__ptr[*(int *)(uVar6 + 0x24)];
      }
      lVar4 = lVar4 + 1;
    } while (lVar2 != lVar4);
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
    __ptr_00->pArray = (int *)0x0;
  }
  if (__ptr_00 != (Vec_Int_t *)0x0) {
    free(__ptr_00);
  }
  Aig_ManStop(pAig);
  Abc_NtkDelete(pNtk_00);
  return fVar7;
}

Assistant:

float Abc_NtkMfsTotalSwitching( Abc_Ntk_t * pNtk )
{
    extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
    extern Vec_Int_t * Saig_ManComputeSwitchProbs( Aig_Man_t * p, int nFrames, int nPref, int fProbOne );
    Vec_Int_t * vSwitching;
    float * pSwitching;
    Abc_Ntk_t * pNtkStr;
    Aig_Man_t * pAig;
    Aig_Obj_t * pObjAig;
    Abc_Obj_t * pObjAbc, * pObjAbc2;
    float Result = (float)0;
    int i;
    // strash the network
    pNtkStr = Abc_NtkStrash( pNtk, 0, 1, 0 );
    Abc_NtkForEachObj( pNtk, pObjAbc, i )
        if ( (pObjAbc->pTemp && Abc_ObjRegular((Abc_Obj_t *)pObjAbc->pTemp)->Type == ABC_FUNC_NONE) || (!Abc_ObjIsCi(pObjAbc) && !Abc_ObjIsNode(pObjAbc)) )
            pObjAbc->pTemp = NULL;
    // map network into an AIG
    pAig = Abc_NtkToDar( pNtkStr, 0, (int)(Abc_NtkLatchNum(pNtk) > 0) );
    vSwitching = Saig_ManComputeSwitchProbs( pAig, 48, 16, 0 );
    pSwitching = (float *)vSwitching->pArray;
    Abc_NtkForEachObj( pNtk, pObjAbc, i )
    {
        if ( (pObjAbc2 = Abc_ObjRegular((Abc_Obj_t *)pObjAbc->pTemp)) && (pObjAig = Aig_Regular((Aig_Obj_t *)pObjAbc2->pTemp)) )
        {
            Result += Abc_ObjFanoutNum(pObjAbc) * pSwitching[pObjAig->Id];
//            Abc_ObjPrint( stdout, pObjAbc );
//            printf( "%d = %.2f\n", i, Abc_ObjFanoutNum(pObjAbc) * pSwitching[pObjAig->Id] );
        }
    }
    Vec_IntFree( vSwitching );
    Aig_ManStop( pAig );
    Abc_NtkDelete( pNtkStr );
    return Result;
}